

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_solitaire::archivers::interfaces::Snapshot_*>::Matcher
          (Matcher<const_solitaire::archivers::interfaces::Snapshot_*> *this,Snapshot *value)

{
  ComparisonBase<testing::internal::EqMatcher<const_solitaire::archivers::interfaces::Snapshot_*>,_const_solitaire::archivers::interfaces::Snapshot_*,_testing::internal::AnyEq>
  local_38;
  Matcher<const_solitaire::archivers::interfaces::Snapshot_*> local_30;
  Snapshot *local_18;
  Snapshot *value_local;
  Matcher<const_solitaire::archivers::interfaces::Snapshot_*> *this_local;
  
  local_18 = value;
  value_local = (Snapshot *)this;
  internal::MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*>::MatcherBase
            (&this->super_MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*>);
  (this->super_MatcherBase<const_solitaire::archivers::interfaces::Snapshot_*>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_004fb770;
  local_38.rhs_ = (Snapshot *)Eq<solitaire::archivers::interfaces::Snapshot_const*>(local_18);
  Matcher<solitaire::archivers::interfaces::Snapshot_const*>::
  Matcher<testing::internal::EqMatcher<solitaire::archivers::interfaces::Snapshot_const*>,void>
            ((Matcher<solitaire::archivers::interfaces::Snapshot_const*> *)&local_30,
             (EqMatcher<const_solitaire::archivers::interfaces::Snapshot_*> *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }